

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# location.c
# Opt level: O2

Location_Relative * get_relative_location(Location *base,size_t offset)

{
  Location_Relative *pLVar1;
  
  pLVar1 = (Location_Relative *)malloc(0x18);
  pLVar1->type = LT_RELATIVE;
  pLVar1->base = base;
  pLVar1->offset = offset;
  return pLVar1;
}

Assistant:

struct Location_Relative* get_relative_location(struct Location *base,size_t offset)
{
	struct Location_Relative *ret;
	ret=malloc(sizeof(struct Location_Relative));
	ret->type=LT_RELATIVE;
	ret->base=base;
	ret->offset=offset;

	return ret;
}